

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod
          (ImmutableServiceGenerator *this,Printer *printer)

{
  int iVar1;
  Printer *pPVar2;
  int iVar3;
  MethodDescriptor *method_00;
  string_view local_b8;
  string_view local_a8 [2];
  string local_88;
  string_view local_68;
  string_view local_58;
  MethodDescriptor *local_48;
  MethodDescriptor *method;
  undefined1 auStack_38 [4];
  int i;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableServiceGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "public static com.google.protobuf.Service newReflectiveService(\n    final Interface impl) {\n  return new $classname$() {\n"
            );
  _auStack_38 = ServiceDescriptor::name((this->super_ServiceGenerator).descriptor_);
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,local_28,(char (*) [10])0xa117a7,
             (basic_string_view<char,_std::char_traits<char>_> *)auStack_38);
  io::Printer::Indent(local_18);
  io::Printer::Indent(local_18);
  method._4_4_ = 0;
  while( true ) {
    iVar1 = method._4_4_;
    iVar3 = ServiceDescriptor::method_count((this->super_ServiceGenerator).descriptor_);
    if (iVar3 <= iVar1) break;
    local_48 = ServiceDescriptor::method((this->super_ServiceGenerator).descriptor_,method._4_4_);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,"@java.lang.Override\n");
    io::Printer::Print<>(pPVar2,local_58);
    GenerateMethodSignature(this,local_18,local_48,IS_CONCRETE);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68," {\n  impl.$method$(controller, request, done);\n}\n\n");
    UnderscoresToCamelCase_abi_cxx11_(&local_88,(java *)local_48,method_00);
    io::Printer::Print<char[7],std::__cxx11::string>
              (pPVar2,local_68,(char (*) [7])0xa8bd3c,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    method._4_4_ = method._4_4_ + 1;
  }
  io::Printer::Outdent(local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_a8,"};\n");
  io::Printer::Print<>(pPVar2,local_a8[0]);
  io::Printer::Outdent(local_18);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"}\n\n");
  io::Printer::Print<>(pPVar2,local_b8);
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.Service newReflectiveService(\n"
      "    final Interface impl) {\n"
      "  return new $classname$() {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    printer->Print("@java.lang.Override\n");
    GenerateMethodSignature(printer, method, IS_CONCRETE);
    printer->Print(
        " {\n"
        "  impl.$method$(controller, request, done);\n"
        "}\n\n",
        "method", UnderscoresToCamelCase(method));
  }

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}